

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void poly3_from_poly(poly3 *out,poly *in)

{
  uint16_t uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint i;
  long lVar6;
  poly2 *local_38;
  
  local_38 = &out->a;
  uVar5 = 0;
  uVar3 = 0;
  iVar4 = 0;
  for (lVar6 = 0; lVar6 != 0x2bd; lVar6 = lVar6 + 1) {
    uVar1 = mod3((short)((int)((uint)(in->field_0).v[lVar6] << 0x13) >> 0x13));
    uVar2 = (ulong)(uVar1 & 2) << 0x3e;
    uVar5 = uVar5 >> 1 | uVar2;
    uVar3 = (ulong)uVar1 << 0x3f | uVar3 >> 1 | uVar2;
    iVar4 = iVar4 + 1;
    if (iVar4 == 0x40) {
      (out->s).v[0] = uVar5;
      out = (poly3 *)((out->s).v + 1);
      local_38->v[0] = uVar3;
      local_38 = (poly2 *)(local_38->v + 1);
      uVar5 = 0;
      uVar3 = 0;
      iVar4 = 0;
    }
  }
  (out->s).v[0] = uVar5 >> (-(char)iVar4 & 0x3fU);
  local_38->v[0] = uVar3 >> (-(char)iVar4 & 0x3fU);
  return;
}

Assistant:

static void poly3_from_poly(struct poly3 *out, const struct poly *in) {
  crypto_word_t *words_s = out->s.v;
  crypto_word_t *words_a = out->a.v;
  crypto_word_t s = 0;
  crypto_word_t a = 0;
  unsigned shift = 0;

  for (unsigned i = 0; i < N; i++) {
    // This duplicates the 13th bit upwards to the top of the uint16,
    // essentially treating it as a sign bit and converting into a signed int16.
    // The signed value is reduced mod 3, yielding {0, 1, 2}.
    const uint16_t v = mod3((int16_t)(in->v[i] << 3) >> 3);
    s >>= 1;
    const crypto_word_t s_bit = (crypto_word_t)(v & 2) << (BITS_PER_WORD - 2);
    s |= s_bit;
    a >>= 1;
    a |= s_bit | (crypto_word_t)(v & 1) << (BITS_PER_WORD - 1);
    shift++;

    if (shift == BITS_PER_WORD) {
      *words_s = s;
      words_s++;
      *words_a = a;
      words_a++;
      s = a = 0;
      shift = 0;
    }
  }

  s >>= BITS_PER_WORD - shift;
  a >>= BITS_PER_WORD - shift;
  *words_s = s;
  *words_a = a;
}